

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dac(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  size_t local_40;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int val;
  int index;
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  local_40 = pjVar2->bytes_in_buffer;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  local_40 = local_40 - 1;
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  _val = (ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100;
  do {
    _val = _val + -2;
    bytes_in_buffer = bytes_in_buffer + 1;
    local_40 = local_40 - 1;
    if (_val < 1) {
      if (_val != 0) {
        cinfo->err->msg_code = 0xc;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pjVar2->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar2->bytes_in_buffer = local_40;
      return 1;
    }
    if (local_40 == 0) {
      bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar3 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar2->next_input_byte;
      local_40 = pjVar2->bytes_in_buffer;
    }
    local_40 = local_40 - 1;
    uVar4 = (uint)*(byte *)bytes_in_buffer;
    bytes_in_buffer = bytes_in_buffer + 1;
    if (local_40 == 0) {
      bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
      if (bVar3 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar2->next_input_byte;
      local_40 = pjVar2->bytes_in_buffer;
    }
    bVar1 = *(byte *)bytes_in_buffer;
    uVar5 = (uint)bVar1;
    cinfo->err->msg_code = 0x51;
    *(uint *)&cinfo->err->msg_parm = uVar4;
    (cinfo->err->msg_parm).i[1] = uVar5;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    if (0x1f < uVar4) {
      cinfo->err->msg_code = 0x1d;
      *(uint *)&cinfo->err->msg_parm = uVar4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (uVar4 < 0x10) {
      cinfo->arith_dc_L[(int)uVar4] = bVar1 & 0xf;
      cinfo->arith_dc_U[(int)uVar4] = (UINT8)((int)uVar5 >> 4);
      if (cinfo->arith_dc_U[(int)uVar4] < cinfo->arith_dc_L[(int)uVar4]) {
        cinfo->err->msg_code = 0x1e;
        (cinfo->err->msg_parm).i[0] = uVar5;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
    else {
      cinfo->arith_ac_K[(int)(uVar4 - 0x10)] = bVar1;
    }
  } while( true );
}

Assistant:

LOCAL(boolean)
get_dac (j_decompress_ptr cinfo)
/* Process a DAC marker */
{
  INT32 length;
  int index, val;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;
  
  while (length > 0) {
    INPUT_BYTE(cinfo, index, return FALSE);
    INPUT_BYTE(cinfo, val, return FALSE);

    length -= 2;

    TRACEMS2(cinfo, 1, JTRC_DAC, index, val);

    if (index < 0 || index >= (2*NUM_ARITH_TBLS))
      ERREXIT1(cinfo, JERR_DAC_INDEX, index);

    if (index >= NUM_ARITH_TBLS) { /* define AC table */
      cinfo->arith_ac_K[index-NUM_ARITH_TBLS] = (UINT8) val;
    } else {			/* define DC table */
      cinfo->arith_dc_L[index] = (UINT8) (val & 0x0F);
      cinfo->arith_dc_U[index] = (UINT8) (val >> 4);
      if (cinfo->arith_dc_L[index] > cinfo->arith_dc_U[index])
	ERREXIT1(cinfo, JERR_DAC_VALUE, val);
    }
  }

  if (length != 0)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_SYNC(cinfo);
  return TRUE;
}